

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_add.c
# Opt level: O0

word zzSubW(word *b,word *a,size_t n,word w)

{
  size_t i;
  word w_local;
  size_t n_local;
  word *a_local;
  word *b_local;
  
  w_local = w;
  for (i = 0; i < n; i = i + 1) {
    b[i] = a[i] - w_local;
    w_local = (word)(int)(uint)((w_local ^ 0xffffffffffffffff) < b[i]);
  }
  return w_local;
}

Assistant:

word zzSubW(word b[], const word a[], size_t n, register word w)
{
	size_t i;
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	for (i = 0; i < n; ++i)
#ifndef SAFE_FAST
		b[i] = a[i] - w, w = wordLess01(~w, b[i]);
#else
		b[i] = a[i] - w, w = b[i] > (word)~w;
#endif
	return w;
}